

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

lys_node_grp * lys_find_grouping_up(char *name,lys_node *start)

{
  int iVar1;
  lys_module *plVar2;
  lys_node *local_38;
  lys_node *stop;
  lys_node *iter;
  lys_node *par_iter;
  lys_node *start_local;
  char *name_local;
  
  iter = start;
  do {
    if (iter == (lys_node *)0x0) {
      return (lys_node_grp *)0x0;
    }
    if (((iter->parent != (lys_node *)0x0) && (iter->parent->parent == (lys_node *)0x0)) &&
       (iter->parent->nodetype == LYS_AUGMENT)) {
      plVar2 = lys_main_module(iter->parent->module);
      iter = plVar2->data;
      if (iter == (lys_node *)0x0) {
        return (lys_node_grp *)0x0;
      }
    }
    if (iter->nodetype == LYS_EXT) {
      plVar2 = lys_main_module(iter->module);
      iter = plVar2->data;
      if (iter == (lys_node *)0x0) {
        return (lys_node_grp *)0x0;
      }
LAB_00189897:
      local_38 = (lys_node *)0x0;
      for (stop = iter; stop != (lys_node *)0x0; stop = stop->prev) {
        if (local_38 == (lys_node *)0x0) {
          local_38 = iter;
        }
        else if (stop == local_38) break;
        if ((stop->nodetype == LYS_GROUPING) && (iVar1 = strcmp(name,stop->name), iVar1 == 0)) {
          return (lys_node_grp *)stop;
        }
      }
    }
    else if ((iter->parent == (lys_node *)0x0) ||
            ((iter->parent->nodetype & (LYS_AUGMENT|LYS_USES|LYS_CASE|LYS_CHOICE)) == LYS_UNKNOWN))
    goto LAB_00189897;
    iter = iter->parent;
  } while( true );
}

Assistant:

struct lys_node_grp *
lys_find_grouping_up(const char *name, struct lys_node *start)
{
    struct lys_node *par_iter, *iter, *stop;

    for (par_iter = start; par_iter; par_iter = par_iter->parent) {
        /* top-level augment, look into module (uses augment is handled correctly below) */
        if (par_iter->parent && !par_iter->parent->parent && (par_iter->parent->nodetype == LYS_AUGMENT)) {
            par_iter = lys_main_module(par_iter->parent->module)->data;
            if (!par_iter) {
                break;
            }
        }

        if (par_iter->nodetype == LYS_EXT) {
            /* we are in a top-level extension, search grouping in top-level groupings */
            par_iter = lys_main_module(par_iter->module)->data;
            if (!par_iter) {
                /* not connected yet, wait */
                return NULL;
            }
        } else if (par_iter->parent && (par_iter->parent->nodetype & (LYS_CHOICE | LYS_CASE | LYS_AUGMENT | LYS_USES))) {
            continue;
        }

        for (iter = par_iter, stop = NULL; iter; iter = iter->prev) {
            if (!stop) {
                stop = par_iter;
            } else if (iter == stop) {
                break;
            }
            if (iter->nodetype != LYS_GROUPING) {
                continue;
            }

            if (!strcmp(name, iter->name)) {
                return (struct lys_node_grp *)iter;
            }
        }
    }

    return NULL;
}